

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O3

void * zuser_malloc(int bytes,int which_end,GlobalLU_t *Glu)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  
  iVar4 = (Glu->stack).used + bytes;
  if (iVar4 < (Glu->stack).size) {
    if (which_end == 0) {
      iVar1 = (Glu->stack).top1;
      pvVar3 = (void *)((long)iVar1 + (long)(Glu->stack).array);
      (Glu->stack).top1 = bytes + iVar1;
    }
    else {
      lVar2 = (long)(Glu->stack).top2 - (long)bytes;
      (Glu->stack).top2 = (int_t)lVar2;
      pvVar3 = (void *)(lVar2 + (long)(Glu->stack).array);
    }
    (Glu->stack).used = iVar4;
    return pvVar3;
  }
  return (void *)0x0;
}

Assistant:

void *zuser_malloc(int bytes, int which_end, GlobalLU_t *Glu)
{
    void *buf;
    
    if ( StackFull(bytes) ) return (NULL);

    if ( which_end == HEAD ) {
	buf = (char*) Glu->stack.array + Glu->stack.top1;
	Glu->stack.top1 += bytes;
    } else {
	Glu->stack.top2 -= bytes;
	buf = (char*) Glu->stack.array + Glu->stack.top2;
    }
    
    Glu->stack.used += bytes;
    return buf;
}